

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

bool comparesEqual(QString *s1,char16_t *s2)

{
  char16_t *pcVar1;
  long lVar2;
  undefined1 uVar3;
  long lVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  pcVar1 = (s1->d).ptr;
  lVar2 = (s1->d).size;
  if (s2 == (char16_t *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = QtPrivate::qustrlen(s2);
  }
  if (lVar2 == lVar4) {
    QVar5.m_data = pcVar1;
    QVar5.m_size = lVar2;
    QVar6.m_data = s2;
    QVar6.m_size = lVar2;
    uVar3 = QtPrivate::equalStrings(QVar5,QVar6);
    return (bool)uVar3;
  }
  return false;
}

Assistant:

bool comparesEqual(const QString &s1, const char16_t *s2) noexcept
    { return comparesEqual(s1, QStringView(s2)); }